

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

void __thiscall ftxui::Text::~Text(Text *this)

{
  Text *this_local;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Text_0021aab8;
  std::__cxx11::string::~string((string *)&this->text_);
  Node::~Node(&this->super_Node);
  return;
}

Assistant:

Text(std::string text) : text_(text) {}